

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMaterial.cpp
# Opt level: O3

void __thiscall
Assimp::FBX::Material::Material
          (Material *this,uint64_t id,Element *element,Document *doc,string *name)

{
  size_type sVar1;
  pointer pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Connection *this_01;
  _Alloc_hider _Var3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  int iVar5;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
  *this_02;
  const_iterator cVar6;
  Token *pTVar7;
  Object *pOVar8;
  mapped_type pTVar9;
  iterator iVar10;
  mapped_type *ppTVar11;
  LayeredTexture *this_03;
  iterator iVar12;
  mapped_type *ppLVar13;
  char *pcVar14;
  Token *t;
  _Rb_tree_header *p_Var15;
  Element *el;
  size_type sVar16;
  pointer ppCVar17;
  string *prop;
  Element *el_00;
  string *__k;
  string templateName;
  key_type local_d0;
  Element *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  LayeredTextureMap *local_80;
  TextureMap *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  Document *local_68;
  _Base_ptr local_60;
  _Base_ptr local_58;
  pointer local_50;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_> local_48
  ;
  
  Object::Object(&this->super_Object,id,element,name);
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__Material_0025cc98;
  local_88 = &this->shading;
  local_70 = &(this->shading).field_2;
  (this->shading)._M_dataplus._M_p = (pointer)local_70;
  (this->shading)._M_string_length = 0;
  (this->shading).field_2._M_local_buf[0] = '\0';
  (this->props).super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->props).super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_78 = &this->textures;
  local_58 = &(this->textures)._M_t._M_impl.super__Rb_tree_header._M_header;
  (this->textures)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->textures)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->textures)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_58;
  (this->textures)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_58;
  (this->textures)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_80 = &this->layeredTextures;
  local_60 = &(this->layeredTextures)._M_t._M_impl.super__Rb_tree_header._M_header;
  (this->layeredTextures)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->layeredTextures)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->layeredTextures)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_60;
  (this->layeredTextures)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_60;
  (this->layeredTextures)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b0 = element;
  this_02 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
             *)GetRequiredScope(element);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"ShadingModel","");
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
          ::find(this_02,&local_d0);
  p_Var15 = &(this_02->_M_impl).super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar6._M_node == p_Var15) {
    el_00 = (Element *)0x0;
  }
  else {
    el_00 = *(Element **)(cVar6._M_node + 2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"MultiLayer","");
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
          ::find(this_02,&local_d0);
  pbVar4 = local_88;
  if ((_Rb_tree_header *)cVar6._M_node == p_Var15) {
    el = (Element *)0x0;
  }
  else {
    el = *(Element **)(cVar6._M_node + 2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if (el != (Element *)0x0) {
    pTVar7 = GetRequiredToken(el,0);
    iVar5 = ParseTokenAsInt(pTVar7);
    this->multilayer = iVar5 != 0;
  }
  if (el_00 == (Element *)0x0) {
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,"shading mode not specified, assuming phong","");
    Util::DOMWarning(&local_d0,local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    std::__cxx11::string::_M_replace
              ((ulong)pbVar4,0,(char *)(this->shading)._M_string_length,0x1f8c47);
  }
  else {
    pTVar7 = GetRequiredToken(el_00,0);
    ParseTokenAsString_abi_cxx11_(&local_d0,(FBX *)pTVar7,t);
    std::__cxx11::string::operator=((string *)pbVar4,(string *)&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  local_d0._M_string_length = 0;
  local_d0.field_2._M_local_buf[0] = '\0';
  sVar1 = (this->shading)._M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (this->shading)._M_dataplus._M_p;
    sVar16 = 0;
    do {
      iVar5 = tolower((int)pcVar2[sVar16]);
      pcVar2[sVar16] = (char)iVar5;
      sVar16 = sVar16 + 1;
    } while (sVar1 != sVar16);
  }
  pbVar4 = local_88;
  iVar5 = std::__cxx11::string::compare((char *)local_88);
  if (iVar5 == 0) {
    pcVar14 = "Material.FbxSurfacePhong";
  }
  else {
    iVar5 = std::__cxx11::string::compare((char *)pbVar4);
    if (iVar5 != 0) {
      std::operator+(&local_a8,"shading mode not recognized: ",pbVar4);
      Util::DOMWarning(&local_a8,local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p);
      }
      goto LAB_0018cf80;
    }
    pcVar14 = "Material.FbxSurfaceLambert";
  }
  std::__cxx11::string::_M_replace
            ((ulong)&local_d0,0,(char *)local_d0._M_string_length,(ulong)pcVar14);
LAB_0018cf80:
  Util::GetPropertyTable((Util *)&local_a8,doc,&local_d0,local_b0,(Scope *)this_02,false);
  sVar1 = local_a8._M_string_length;
  _Var3._M_p = local_a8._M_dataplus._M_p;
  local_a8._M_dataplus._M_p = (pointer)0x0;
  local_a8._M_string_length = 0;
  this_00 = (this->props).
            super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->props).super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)_Var3._M_p;
  (this->props).super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar1;
  if ((this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00),
     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._M_string_length !=
     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._M_string_length);
  }
  Document::GetConnectionsByDestinationSequenced(&local_48,doc,(this->super_Object).id);
  local_50 = local_48.
             super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_48.
      super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ppCVar17 = local_48.
               super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_68 = doc;
    do {
      this_01 = *ppCVar17;
      if ((this_01->prop)._M_string_length != 0) {
        pOVar8 = Connection::SourceObject(this_01);
        if (pOVar8 == (Object *)0x0) {
          local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a8,"failed to read source object for texture link, ignoring",
                     "");
          Util::DOMWarning(&local_a8,local_b0);
LAB_0018d0eb:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p);
          }
        }
        else {
          __k = &this_01->prop;
          pTVar9 = (mapped_type)__dynamic_cast(pOVar8,&Object::typeinfo,&Texture::typeinfo,0);
          if (pTVar9 == (mapped_type)0x0) {
            this_03 = (LayeredTexture *)
                      __dynamic_cast(pOVar8,&Object::typeinfo,&LayeredTexture::typeinfo,0);
            if (this_03 == (LayeredTexture *)0x0) {
              local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_a8,
                         "source object for texture link is not a texture or layered texture, ignoring"
                         ,"");
              Util::DOMWarning(&local_a8,local_b0);
              goto LAB_0018d0eb;
            }
            iVar12 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::LayeredTexture_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::LayeredTexture_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::LayeredTexture_*>_>_>
                     ::find(&local_80->_M_t,__k);
            if (iVar12._M_node != local_60) {
              std::operator+(&local_a8,"duplicate layered texture link: ",__k);
              Util::DOMWarning(&local_a8,local_b0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                operator_delete(local_a8._M_dataplus._M_p);
              }
            }
            ppLVar13 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::LayeredTexture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::LayeredTexture_*>_>_>
                       ::operator[](local_80,__k);
            *ppLVar13 = this_03;
            LayeredTexture::fillTexture(this_03,local_68);
          }
          else {
            iVar10 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Texture_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Texture_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Texture_*>_>_>
                     ::find(&local_78->_M_t,__k);
            if (iVar10._M_node != local_58) {
              std::operator+(&local_a8,"duplicate texture link: ",__k);
              Util::DOMWarning(&local_a8,local_b0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                operator_delete(local_a8._M_dataplus._M_p);
              }
            }
            ppTVar11 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Texture_*>_>_>
                       ::operator[](local_78,__k);
            *ppTVar11 = pTVar9;
          }
        }
      }
      ppCVar17 = ppCVar17 + 1;
    } while (ppCVar17 != local_50);
  }
  if (local_48.
      super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  return;
}

Assistant:

Material::Material(uint64_t id, const Element& element, const Document& doc, const std::string& name)
: Object(id,element,name)
{
    const Scope& sc = GetRequiredScope(element);

    const Element* const ShadingModel = sc["ShadingModel"];
    const Element* const MultiLayer = sc["MultiLayer"];

    if(MultiLayer) {
        multilayer = !!ParseTokenAsInt(GetRequiredToken(*MultiLayer,0));
    }

    if(ShadingModel) {
        shading = ParseTokenAsString(GetRequiredToken(*ShadingModel,0));
    }
    else {
        DOMWarning("shading mode not specified, assuming phong",&element);
        shading = "phong";
    }

    std::string templateName;

    // lower-case shading because Blender (for example) writes "Phong"
    std::transform(shading.begin(), shading.end(), shading.begin(), ::tolower);
    if(shading == "phong") {
        templateName = "Material.FbxSurfacePhong";
    }
    else if(shading == "lambert") {
        templateName = "Material.FbxSurfaceLambert";
    }
    else {
        DOMWarning("shading mode not recognized: " + shading,&element);
    }

    props = GetPropertyTable(doc,templateName,element,sc);

    // resolve texture links
    const std::vector<const Connection*>& conns = doc.GetConnectionsByDestinationSequenced(ID());
    for(const Connection* con : conns) {

        // texture link to properties, not objects
        if (!con->PropertyName().length()) {
            continue;
        }

        const Object* const ob = con->SourceObject();
        if(!ob) {
            DOMWarning("failed to read source object for texture link, ignoring",&element);
            continue;
        }

        const Texture* const tex = dynamic_cast<const Texture*>(ob);
        if(!tex) {
            const LayeredTexture* const layeredTexture = dynamic_cast<const LayeredTexture*>(ob);
            if(!layeredTexture) {
                DOMWarning("source object for texture link is not a texture or layered texture, ignoring",&element);
                continue;
            }
            const std::string& prop = con->PropertyName();
            if (layeredTextures.find(prop) != layeredTextures.end()) {
                DOMWarning("duplicate layered texture link: " + prop,&element);
            }

            layeredTextures[prop] = layeredTexture;
            ((LayeredTexture*)layeredTexture)->fillTexture(doc);
        }
        else
        {
            const std::string& prop = con->PropertyName();
            if (textures.find(prop) != textures.end()) {
                DOMWarning("duplicate texture link: " + prop,&element);
            }

            textures[prop] = tex;
        }

    }
}